

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::IntOption::printOptionCall(IntOption *this,stringstream *s)

{
  ostream *poVar1;
  long in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<((ostream *)(in_RSI + 0x10),"-");
  poVar1 = std::operator<<(poVar1,*(char **)(in_RDI + 8));
  poVar1 = std::operator<<(poVar1,"=");
  std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x38));
  return;
}

Assistant:

virtual void printOptionCall(std::stringstream &s) { s << "-" << name << "=" << value; }